

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FiniteModelMultiSorted.hpp
# Opt level: O0

string * __thiscall
FMB::FiniteModelMultiSorted::append(FiniteModelMultiSorted *this,string *name,char *suffix)

{
  ulong uVar1;
  char *pcVar2;
  ulong in_RDX;
  string *in_RDI;
  string dequoted;
  char *in_stack_fffffffffffffef0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef8;
  string *__lhs;
  allocator<char> *in_stack_ffffffffffffff20;
  char *in_stack_ffffffffffffff28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  string local_c0 [39];
  undefined1 local_99 [33];
  string local_78 [32];
  string local_58 [55];
  allocator<char> local_21 [33];
  
  __lhs = in_RDI;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    pcVar2 = (char *)std::__cxx11::string::operator[](in_RDX);
    if (*pcVar2 == '$') {
      __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_99;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
      std::operator+(in_stack_fffffffffffffef8,__rhs);
      std::operator+(in_stack_fffffffffffffef8,(char *)__rhs);
      std::operator+(in_stack_fffffffffffffef8,(char *)__rhs);
      std::__cxx11::string::~string(local_58);
      std::__cxx11::string::~string(local_78);
      std::__cxx11::string::~string((string *)(local_99 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_99);
    }
    else {
      pcVar2 = (char *)std::__cxx11::string::operator[](in_RDX);
      if (*pcVar2 == '\'') {
        std::__cxx11::string::length();
        std::__cxx11::string::substr((ulong)local_c0,in_RDX);
        std::operator+(__lhs,(char *)in_RDI);
        std::operator+(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
        std::__cxx11::string::~string((string *)&stack0xffffffffffffff20);
        std::__cxx11::string::~string(local_c0);
      }
      else {
        std::operator+(__lhs,(char *)in_RDI);
      }
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
    std::allocator<char>::~allocator(local_21);
  }
  return __lhs;
}

Assistant:

std::string append(std::string name, const char* suffix) {
    if (name.empty()) {
      return std::string(suffix);
    } else if(name[0] == '$') {
      return std::string("'") + name + suffix + "'";
    } else if (name[0] == '\'') {
      std::string dequoted = name.substr(0, name.length() - 1);
      return dequoted + suffix + "'";
    } else {
      return name + suffix;
    }
  }